

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

void __thiscall TasGrid::GridSequence::setHierarchicalCoefficients(GridSequence *this,double *c)

{
  MultiIndexSet *this_00;
  size_t sVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> x;
  vector<double,_std::allocator<double>_> y;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_68;
  MultiIndexSet local_48;
  
  clearGpuSurpluses(this);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &(this->super_BaseCanonicalGrid).needed;
    MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).points,this_00);
    local_48.num_dimensions = 0;
    local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
    local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    MultiIndexSet::operator=(this_00,&local_48);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_48.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])(this);
  }
  lVar2 = (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar1 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_88,c,c + sVar1 * lVar2,
             (allocator_type *)&local_68);
  local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_88._M_impl.super__Vector_impl_data._M_start;
  local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_88._M_impl.super__Vector_impl_data._M_finish;
  local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.num_dimensions = sVar1;
  local_48._8_8_ = lVar2;
  Data2D<double>::operator=(&this->surpluses,(Data2D<double> *)&local_48);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_48.indexes);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,
             (this->super_BaseCanonicalGrid).num_dimensions * lVar2,(allocator_type *)&local_48);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_68,
             (this->super_BaseCanonicalGrid).num_outputs * lVar2,(allocator_type *)&local_48);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0xb])
            (this,local_88._M_impl.super__Vector_impl_data._M_start);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x13])
            (this,local_88._M_impl.super__Vector_impl_data._M_start,
             (ulong)(uint)(this->super_BaseCanonicalGrid).points.cache_num_indexes,
             local_68._M_impl.super__Vector_impl_data._M_start);
  local_48.num_dimensions = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_68._M_impl.super__Vector_impl_data._M_start;
  local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_68._M_impl.super__Vector_impl_data._M_finish;
  local_48.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._8_8_ = lVar2;
  StorageSet::operator=(&(this->super_BaseCanonicalGrid).values,(StorageSet *)&local_48);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_48.indexes);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void GridSequence::setHierarchicalCoefficients(const double c[]){
    clearGpuSurpluses(); // points have not changed, just clear surpluses
    if (!points.empty()){
        clearRefinement();
    }else{
        points = std::move(needed);
        needed = MultiIndexSet();
    }
    auto num_points = points.getNumIndexes();
    surpluses = Data2D<double>(num_outputs, num_points, std::vector<double>(c, c + Utils::size_mult(num_outputs, num_points)));

    std::vector<double> x(Utils::size_mult(num_dimensions, num_points));
    std::vector<double> y(Utils::size_mult(num_outputs,    num_points));

    getPoints(x.data());
    evaluateBatch(x.data(), points.getNumIndexes(), y.data()); // speed this up later

    values = StorageSet(num_outputs, num_points, std::move(y));
}